

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Scene *pSVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  uint uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  byte bVar29;
  uint uVar30;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar31) [32];
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  byte bVar36;
  int iVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar98;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  float fVar105;
  undefined1 auVar106 [16];
  undefined4 uVar107;
  undefined1 auVar108 [32];
  undefined8 uVar109;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar125 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2808;
  ulong *local_27c8;
  int local_27a4;
  long local_27a0;
  long local_2798;
  long local_2790;
  long local_2788;
  RTCFilterFunctionNArguments local_2780;
  float local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined4 local_273c;
  uint local_2738;
  uint local_2734;
  uint local_2730;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar80 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_27c8 = local_2390;
    local_2398[0] = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar48 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar137 = ZEXT1664(auVar48);
    auVar49 = vmaxss_avx512f(auVar48,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar117 = (ray->super_RayK<1>).tfar;
    auVar104 = ZEXT464((uint)fVar117);
    auVar50._8_4_ = 0x7fffffff;
    auVar50._0_8_ = 0x7fffffff7fffffff;
    auVar50._12_4_ = 0x7fffffff;
    auVar50 = vandps_avx512vl((undefined1  [16])aVar3,auVar50);
    auVar51 = vmaxss_avx512f(auVar48,ZEXT416((uint)fVar117));
    auVar52._8_4_ = 0x219392ef;
    auVar52._0_8_ = 0x219392ef219392ef;
    auVar52._12_4_ = 0x219392ef;
    uVar45 = vcmpps_avx512vl(auVar50,auVar52,1);
    auVar60._8_4_ = 0x3f800000;
    auVar60._0_8_ = 0x3f8000003f800000;
    auVar60._12_4_ = 0x3f800000;
    auVar50 = vdivps_avx(auVar60,(undefined1  [16])aVar3);
    auVar52 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar46 = (bool)((byte)uVar45 & 1);
    auVar71._0_4_ = (uint)bVar46 * auVar52._0_4_ | (uint)!bVar46 * auVar50._0_4_;
    bVar46 = (bool)((byte)(uVar45 >> 1) & 1);
    auVar71._4_4_ = (uint)bVar46 * auVar52._4_4_ | (uint)!bVar46 * auVar50._4_4_;
    bVar46 = (bool)((byte)(uVar45 >> 2) & 1);
    auVar71._8_4_ = (uint)bVar46 * auVar52._8_4_ | (uint)!bVar46 * auVar50._8_4_;
    bVar46 = (bool)((byte)(uVar45 >> 3) & 1);
    auVar71._12_4_ = (uint)bVar46 * auVar52._12_4_ | (uint)!bVar46 * auVar50._12_4_;
    auVar53._8_4_ = 0x3f7ffffa;
    auVar53._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar53._12_4_ = 0x3f7ffffa;
    vmulps_avx512vl(auVar71,auVar53);
    auVar64._8_4_ = 0x3f800003;
    auVar64._0_8_ = 0x3f8000033f800003;
    auVar64._12_4_ = 0x3f800003;
    auVar53 = vmulps_avx512vl(auVar71,auVar64);
    local_26e0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar138 = ZEXT3264(local_26e0);
    local_2700 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar139 = ZEXT3264(local_2700);
    uVar107 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_25a0._4_4_ = uVar107;
    local_25a0._0_4_ = uVar107;
    local_25a0._8_4_ = uVar107;
    local_25a0._12_4_ = uVar107;
    local_25a0._16_4_ = uVar107;
    local_25a0._20_4_ = uVar107;
    local_25a0._24_4_ = uVar107;
    local_25a0._28_4_ = uVar107;
    auVar116 = ZEXT3264(local_25a0);
    auVar52 = vucomiss_avx512f(auVar48);
    fVar105 = auVar52._0_4_;
    auVar50 = vmovshdup_avx(auVar52);
    uVar109 = auVar50._0_8_;
    local_25e0._8_8_ = uVar109;
    local_25e0._0_8_ = uVar109;
    local_25e0._16_8_ = uVar109;
    local_25e0._24_8_ = uVar109;
    auVar123 = ZEXT3264(local_25e0);
    vshufpd_avx(auVar52,auVar52,1);
    auVar76._8_4_ = 2;
    auVar76._0_8_ = 0x200000002;
    auVar76._12_4_ = 2;
    auVar76._16_4_ = 2;
    auVar76._20_4_ = 2;
    auVar76._24_4_ = 2;
    auVar76._28_4_ = 2;
    local_2600 = vpermps_avx2(auVar76,ZEXT1632(auVar52));
    auVar124 = ZEXT3264(local_2600);
    auVar75._8_4_ = 1;
    auVar75._0_8_ = 0x100000001;
    auVar75._12_4_ = 1;
    auVar75._16_4_ = 1;
    auVar75._20_4_ = 1;
    auVar75._24_4_ = 1;
    auVar75._28_4_ = 1;
    fVar98 = auVar53._0_4_;
    local_2640 = vpermps_avx2(auVar75,ZEXT1632(auVar53));
    auVar132 = ZEXT3264(local_2640);
    local_2660 = vpermps_avx512vl(auVar76,ZEXT1632(auVar53));
    auVar133 = ZEXT3264(local_2660);
    lVar40 = 0;
    vucomiss_avx512f(auVar48);
    lVar43 = 0x40;
    vucomiss_avx512f(auVar48);
    local_2680 = vbroadcastss_avx512vl(auVar49);
    auVar134 = ZEXT3264(local_2680);
    uVar107 = auVar51._0_4_;
    auVar102 = ZEXT3264(CONCAT428(uVar107,CONCAT424(uVar107,CONCAT420(uVar107,CONCAT416(uVar107,
                                                  CONCAT412(uVar107,CONCAT48(uVar107,CONCAT44(
                                                  uVar107,uVar107))))))));
    auVar75 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar135 = ZEXT3264(auVar75);
    auVar75 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar136 = ZEXT3264(auVar75);
    local_2798 = 0;
    local_25c0 = fVar105;
    fStack_25bc = fVar105;
    fStack_25b8 = fVar105;
    fStack_25b4 = fVar105;
    fStack_25b0 = fVar105;
    fStack_25ac = fVar105;
    fStack_25a8 = fVar105;
    fStack_25a4 = fVar105;
    local_2620 = fVar98;
    fStack_261c = fVar98;
    fStack_2618 = fVar98;
    fStack_2614 = fVar98;
    fStack_2610 = fVar98;
    fStack_260c = fVar98;
    fStack_2608 = fVar98;
    fStack_2604 = fVar98;
    local_27a0 = 0x40;
    fVar117 = fVar105;
    fVar118 = fVar105;
    fVar119 = fVar105;
    fVar120 = fVar105;
    fVar121 = fVar105;
    fVar122 = fVar105;
    fVar126 = fVar98;
    fVar127 = fVar98;
    fVar128 = fVar98;
    fVar129 = fVar98;
    fVar130 = fVar98;
    fVar131 = fVar98;
LAB_01c71bc5:
    if (local_27c8 != &local_23a0) {
      pfVar1 = (float *)(local_27c8 + -1);
      local_27c8 = local_27c8 + -2;
      if (*pfVar1 <= auVar104._0_4_) {
        uVar45 = *local_27c8;
        do {
          while( true ) {
            uVar107 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar81._4_4_ = uVar107;
            auVar81._0_4_ = uVar107;
            auVar81._8_4_ = uVar107;
            auVar81._12_4_ = uVar107;
            auVar81._16_4_ = uVar107;
            auVar81._20_4_ = uVar107;
            auVar81._24_4_ = uVar107;
            auVar81._28_4_ = uVar107;
            do {
              if ((uVar45 & 8) != 0) {
                local_2790 = (ulong)((uint)uVar45 & 0xf) - 8;
                uVar45 = uVar45 & 0xfffffffffffffff0;
                local_2788 = 0;
                goto LAB_01c71ff3;
              }
              pauVar31 = (undefined1 (*) [32])(uVar45 & 0xfffffffffffffff0);
              auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar31[8] + lVar40),auVar81,
                                        *(undefined1 (*) [32])(pauVar31[2] + lVar40));
              auVar75 = vsubps_avx512vl(ZEXT1632(auVar50),auVar138._0_32_);
              auVar22._4_4_ = fVar117 * auVar75._4_4_;
              auVar22._0_4_ = fVar105 * auVar75._0_4_;
              auVar22._8_4_ = fVar118 * auVar75._8_4_;
              auVar22._12_4_ = fVar119 * auVar75._12_4_;
              auVar22._16_4_ = fVar120 * auVar75._16_4_;
              auVar22._20_4_ = fVar121 * auVar75._20_4_;
              auVar22._24_4_ = fVar122 * auVar75._24_4_;
              auVar22._28_4_ = auVar75._28_4_;
              auVar76 = vmaxps_avx512vl(auVar134._0_32_,auVar22);
              auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar31[8] + lVar43),auVar81,
                                        *(undefined1 (*) [32])(pauVar31[2] + lVar43));
              auVar75 = vsubps_avx512vl(ZEXT1632(auVar50),auVar139._0_32_);
              auVar23._4_4_ = auVar123._4_4_ * auVar75._4_4_;
              auVar23._0_4_ = auVar123._0_4_ * auVar75._0_4_;
              auVar23._8_4_ = auVar123._8_4_ * auVar75._8_4_;
              auVar23._12_4_ = auVar123._12_4_ * auVar75._12_4_;
              auVar23._16_4_ = auVar123._16_4_ * auVar75._16_4_;
              auVar23._20_4_ = auVar123._20_4_ * auVar75._20_4_;
              auVar23._24_4_ = auVar123._24_4_ * auVar75._24_4_;
              auVar23._28_4_ = auVar75._28_4_;
              auVar50 = vfmadd213ps_fma(pauVar31[0xc],auVar81,pauVar31[6]);
              auVar75 = vsubps_avx(ZEXT1632(auVar50),auVar116._0_32_);
              auVar24._4_4_ = auVar124._4_4_ * auVar75._4_4_;
              auVar24._0_4_ = auVar124._0_4_ * auVar75._0_4_;
              auVar24._8_4_ = auVar124._8_4_ * auVar75._8_4_;
              auVar24._12_4_ = auVar124._12_4_ * auVar75._12_4_;
              auVar24._16_4_ = auVar124._16_4_ * auVar75._16_4_;
              auVar24._20_4_ = auVar124._20_4_ * auVar75._20_4_;
              auVar24._24_4_ = auVar124._24_4_ * auVar75._24_4_;
              auVar24._28_4_ = auVar75._28_4_;
              auVar75 = vmaxps_avx(auVar23,auVar24);
              auVar75 = vmaxps_avx(auVar76,auVar75);
              auVar50 = vfmadd213ps_fma(pauVar31[9],auVar81,pauVar31[3]);
              auVar76 = vsubps_avx512vl(ZEXT1632(auVar50),auVar138._0_32_);
              auVar25._4_4_ = fVar126 * auVar76._4_4_;
              auVar25._0_4_ = fVar98 * auVar76._0_4_;
              auVar25._8_4_ = fVar127 * auVar76._8_4_;
              auVar25._12_4_ = fVar128 * auVar76._12_4_;
              auVar25._16_4_ = fVar129 * auVar76._16_4_;
              auVar25._20_4_ = fVar130 * auVar76._20_4_;
              auVar25._24_4_ = fVar131 * auVar76._24_4_;
              auVar25._28_4_ = auVar76._28_4_;
              auVar76 = vminps_avx(auVar102._0_32_,auVar25);
              auVar50 = vfmadd213ps_fma(pauVar31[0xb],auVar81,pauVar31[5]);
              auVar77 = vsubps_avx512vl(ZEXT1632(auVar50),auVar139._0_32_);
              auVar26._4_4_ = auVar132._4_4_ * auVar77._4_4_;
              auVar26._0_4_ = auVar132._0_4_ * auVar77._0_4_;
              auVar26._8_4_ = auVar132._8_4_ * auVar77._8_4_;
              auVar26._12_4_ = auVar132._12_4_ * auVar77._12_4_;
              auVar26._16_4_ = auVar132._16_4_ * auVar77._16_4_;
              auVar26._20_4_ = auVar132._20_4_ * auVar77._20_4_;
              auVar26._24_4_ = auVar132._24_4_ * auVar77._24_4_;
              auVar26._28_4_ = auVar77._28_4_;
              auVar50 = vfmadd213ps_fma(pauVar31[0xd],auVar81,pauVar31[7]);
              auVar77 = vsubps_avx(ZEXT1632(auVar50),auVar116._0_32_);
              auVar77 = vmulps_avx512vl(auVar133._0_32_,auVar77);
              auVar77 = vminps_avx(auVar26,auVar77);
              auVar76 = vminps_avx(auVar76,auVar77);
              uVar47 = vcmpps_avx512vl(auVar75,auVar76,2);
              if (((uint)uVar45 & 7) == 6) {
                uVar45 = vcmpps_avx512vl(auVar81,pauVar31[0xe],0xd);
                uVar34 = vcmpps_avx512vl(auVar81,pauVar31[0xf],1);
                uVar47 = uVar47 & uVar45 & uVar34;
              }
              bVar29 = (byte)uVar47;
              if (bVar29 == 0) {
                auVar50 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                                 ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0))
                ;
                auVar104 = ZEXT1664(auVar50);
                goto LAB_01c71bc5;
              }
              auVar76 = *pauVar31;
              auVar77 = pauVar31[1];
              auVar78 = vmovdqa64_avx512vl(auVar135._0_32_);
              auVar78 = vpternlogd_avx512vl(auVar78,auVar75,auVar136._0_32_,0xf8);
              auVar79 = vpcompressd_avx512vl(auVar78);
              auVar80._0_4_ =
                   (uint)(bVar29 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar78._0_4_;
              bVar46 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar80._4_4_ = (uint)bVar46 * auVar79._4_4_ | (uint)!bVar46 * auVar78._4_4_;
              bVar46 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar80._8_4_ = (uint)bVar46 * auVar79._8_4_ | (uint)!bVar46 * auVar78._8_4_;
              bVar46 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar80._12_4_ = (uint)bVar46 * auVar79._12_4_ | (uint)!bVar46 * auVar78._12_4_;
              bVar46 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar80._16_4_ = (uint)bVar46 * auVar79._16_4_ | (uint)!bVar46 * auVar78._16_4_;
              bVar46 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar80._20_4_ = (uint)bVar46 * auVar79._20_4_ | (uint)!bVar46 * auVar78._20_4_;
              bVar46 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar80._24_4_ = (uint)bVar46 * auVar79._24_4_ | (uint)!bVar46 * auVar78._24_4_;
              bVar46 = SUB81(uVar47 >> 7,0);
              auVar80._28_4_ = (uint)bVar46 * auVar79._28_4_ | (uint)!bVar46 * auVar78._28_4_;
              auVar78 = vpermt2q_avx512vl(auVar76,auVar80,auVar77);
              uVar45 = auVar78._0_8_;
              bVar29 = bVar29 - 1 & bVar29;
            } while (bVar29 == 0);
            auVar81 = vpshufd_avx2(auVar80,0x55);
            vpermt2q_avx512vl(auVar76,auVar81,auVar77);
            auVar78 = vpminsd_avx2(auVar80,auVar81);
            auVar81 = vpmaxsd_avx2(auVar80,auVar81);
            bVar29 = bVar29 - 1 & bVar29;
            if (bVar29 != 0) break;
            auVar78 = vpermi2q_avx512vl(auVar78,auVar76,auVar77);
            uVar45 = auVar78._0_8_;
            auVar76 = vpermt2q_avx512vl(auVar76,auVar81,auVar77);
            *local_27c8 = auVar76._0_8_;
            lVar32 = 8;
            lStack_2808 = 0x10;
LAB_01c71d9a:
            auVar75 = vpermd_avx2(auVar81,auVar75);
            *(int *)((long)local_27c8 + lVar32) = auVar75._0_4_;
            local_27c8 = (ulong *)((long)local_27c8 + lStack_2808);
          }
          auVar94 = vpshufd_avx2(auVar80,0xaa);
          vpermt2q_avx512vl(auVar76,auVar94,auVar77);
          auVar79 = vpminsd_avx2(auVar78,auVar94);
          auVar78 = vpmaxsd_avx2(auVar78,auVar94);
          auVar94 = vpminsd_avx2(auVar81,auVar78);
          auVar78 = vpmaxsd_avx2(auVar81,auVar78);
          bVar29 = bVar29 - 1 & bVar29;
          if (bVar29 == 0) {
            auVar81 = vpermi2q_avx512vl(auVar79,auVar76,auVar77);
            uVar45 = auVar81._0_8_;
            auVar81 = vpermt2q_avx512vl(auVar76,auVar78,auVar77);
            *local_27c8 = auVar81._0_8_;
            auVar81 = vpermd_avx2(auVar78,auVar75);
            *(int *)(local_27c8 + 1) = auVar81._0_4_;
            auVar76 = vpermt2q_avx512vl(auVar76,auVar94,auVar77);
            local_27c8[2] = auVar76._0_8_;
            lStack_2808 = 0x18;
            lVar32 = lStack_2808;
            lStack_2808 = 0x20;
            auVar81 = auVar94;
            goto LAB_01c71d9a;
          }
          auVar81 = vpshufd_avx2(auVar80,0xff);
          vpermt2q_avx512vl(auVar76,auVar81,auVar77);
          auVar83 = vpminsd_avx2(auVar79,auVar81);
          auVar79 = vpmaxsd_avx2(auVar79,auVar81);
          auVar81 = vpminsd_avx2(auVar94,auVar79);
          auVar79 = vpmaxsd_avx2(auVar94,auVar79);
          auVar94 = vpminsd_avx2(auVar78,auVar79);
          auVar78 = vpmaxsd_avx2(auVar78,auVar79);
          bVar29 = bVar29 - 1 & bVar29;
          if (bVar29 == 0) {
            auVar79 = vpermi2q_avx512vl(auVar83,auVar76,auVar77);
            uVar45 = auVar79._0_8_;
            auVar79 = vpermt2q_avx512vl(auVar76,auVar78,auVar77);
            *local_27c8 = auVar79._0_8_;
            auVar78 = vpermd_avx2(auVar78,auVar75);
            *(int *)(local_27c8 + 1) = auVar78._0_4_;
            auVar78 = vpermt2q_avx512vl(auVar76,auVar94,auVar77);
            local_27c8[2] = auVar78._0_8_;
            auVar78 = vpermd_avx2(auVar94,auVar75);
            *(int *)(local_27c8 + 3) = auVar78._0_4_;
            auVar76 = vpermt2q_avx512vl(auVar76,auVar81,auVar77);
            local_27c8[4] = auVar76._0_8_;
            lVar32 = 0x28;
            lStack_2808 = 0x30;
            goto LAB_01c71d9a;
          }
          auVar82 = valignd_avx512vl(auVar80,auVar80,3);
          auVar79 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
          auVar83 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000))),
                                      auVar79,auVar83);
          auVar79 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
          auVar81 = vpermt2d_avx512vl(auVar83,auVar79,auVar81);
          auVar79 = vpermt2d_avx512vl(auVar81,auVar79,auVar94);
          auVar81 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
          auVar81 = vpermt2d_avx512vl(auVar79,auVar81,auVar78);
          auVar104 = ZEXT3264(auVar81);
          bVar36 = bVar29;
          do {
            auVar78 = auVar104._0_32_;
            auVar110._8_4_ = 1;
            auVar110._0_8_ = 0x100000001;
            auVar110._12_4_ = 1;
            auVar110._16_4_ = 1;
            auVar110._20_4_ = 1;
            auVar110._24_4_ = 1;
            auVar110._28_4_ = 1;
            auVar81 = vpermd_avx2(auVar110,auVar82);
            auVar82 = valignd_avx512vl(auVar82,auVar82,1);
            vpermt2q_avx512vl(auVar76,auVar82,auVar77);
            bVar36 = bVar36 - 1 & bVar36;
            uVar109 = vpcmpd_avx512vl(auVar81,auVar78,5);
            auVar81 = vpmaxsd_avx2(auVar81,auVar78);
            bVar15 = (byte)uVar109 << 1;
            auVar78 = valignd_avx512vl(auVar78,auVar78,7);
            bVar46 = (bool)((byte)uVar109 & 1);
            bVar8 = (bool)(bVar15 >> 2 & 1);
            bVar9 = (bool)(bVar15 >> 3 & 1);
            bVar10 = (bool)(bVar15 >> 4 & 1);
            bVar11 = (bool)(bVar15 >> 5 & 1);
            bVar12 = (bool)(bVar15 >> 6 & 1);
            auVar104 = ZEXT3264(CONCAT428((uint)(bVar15 >> 7) * auVar78._28_4_ |
                                          (uint)!(bool)(bVar15 >> 7) * auVar81._28_4_,
                                          CONCAT424((uint)bVar12 * auVar78._24_4_ |
                                                    (uint)!bVar12 * auVar81._24_4_,
                                                    CONCAT420((uint)bVar11 * auVar78._20_4_ |
                                                              (uint)!bVar11 * auVar81._20_4_,
                                                              CONCAT416((uint)bVar10 *
                                                                        auVar78._16_4_ |
                                                                        (uint)!bVar10 *
                                                                        auVar81._16_4_,
                                                                        CONCAT412((uint)bVar9 *
                                                                                  auVar78._12_4_ |
                                                                                  (uint)!bVar9 *
                                                                                  auVar81._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar8 * auVar78._8_4_ |
                                                  (uint)!bVar8 * auVar81._8_4_,
                                                  CONCAT44((uint)bVar46 * auVar78._4_4_ |
                                                           (uint)!bVar46 * auVar81._4_4_,
                                                           auVar81._0_4_))))))));
          } while (bVar36 != 0);
          lVar32 = (ulong)(uint)POPCOUNT((uint)bVar29) + 3;
          while( true ) {
            auVar78 = auVar104._0_32_;
            auVar81 = vpermt2q_avx512vl(auVar76,auVar78,auVar77);
            uVar45 = auVar81._0_8_;
            bVar46 = lVar32 == 0;
            lVar32 = lVar32 + -1;
            if (bVar46) break;
            *local_27c8 = uVar45;
            auVar81 = vpermd_avx2(auVar78,auVar75);
            *(int *)(local_27c8 + 1) = auVar81._0_4_;
            auVar81 = valignd_avx512vl(auVar78,auVar78,1);
            auVar104 = ZEXT3264(auVar81);
            local_27c8 = local_27c8 + 2;
          }
          auVar50 = vxorps_avx512vl(auVar137._0_16_,auVar137._0_16_);
          auVar137 = ZEXT1664(auVar50);
          auVar138 = ZEXT3264(local_26e0);
          auVar139 = ZEXT3264(local_2700);
        } while( true );
      }
      goto LAB_01c71bc5;
    }
  }
  return;
LAB_01c71ff3:
  if (local_2788 == local_2790) goto LAB_01c72c98;
  lVar41 = local_2788 * 0x60;
  pSVar4 = context->scene;
  pRVar5 = (pSVar4->geometries).items;
  pGVar6 = pRVar5[*(uint *)(uVar45 + 0x40 + lVar41)].ptr;
  fVar117 = (pGVar6->time_range).lower;
  fVar117 = pGVar6->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar117) /
            ((pGVar6->time_range).upper - fVar117));
  auVar50 = vroundss_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),9);
  auVar50 = vminss_avx(auVar50,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar54 = vmaxss_avx512f(auVar137._0_16_,auVar50);
  iVar37 = (int)auVar54._0_4_;
  lVar35 = (long)iVar37 * 0x38;
  lVar40 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar35);
  auVar50 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar45 + lVar41) * 4);
  uVar34 = (ulong)*(uint *)(uVar45 + 0x10 + lVar41);
  auVar52 = *(undefined1 (*) [16])(lVar40 + uVar34 * 4);
  uVar39 = (ulong)*(uint *)(uVar45 + 0x20 + lVar41);
  auVar53 = *(undefined1 (*) [16])(lVar40 + uVar39 * 4);
  uVar42 = (ulong)*(uint *)(uVar45 + 0x30 + lVar41);
  auVar64 = *(undefined1 (*) [16])(lVar40 + uVar42 * 4);
  uVar47 = CONCAT44(0,*(uint *)(uVar45 + 4 + lVar41));
  local_2720._0_8_ = uVar47;
  lVar33 = (long)(iVar37 + 1) * 0x38;
  lVar40 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar33);
  auVar48 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar45 + lVar41) * 4);
  auVar49 = *(undefined1 (*) [16])(lVar40 + uVar34 * 4);
  lVar43 = *(long *)&pRVar5[*(uint *)(uVar45 + 0x44 + lVar41)].ptr[2].numPrimitives;
  lVar32 = *(long *)(lVar43 + lVar35);
  auVar51 = *(undefined1 (*) [16])(lVar32 + uVar47 * 4);
  auVar71 = *(undefined1 (*) [16])(lVar40 + uVar39 * 4);
  uVar39 = (ulong)*(uint *)(uVar45 + 0x14 + lVar41);
  auVar60 = *(undefined1 (*) [16])(lVar32 + uVar39 * 4);
  auVar73 = *(undefined1 (*) [16])(lVar40 + uVar42 * 4);
  uVar34 = (ulong)*(uint *)(uVar45 + 0x24 + lVar41);
  auVar63 = *(undefined1 (*) [16])(lVar32 + uVar34 * 4);
  uVar44 = (ulong)*(uint *)(uVar45 + 0x34 + lVar41);
  auVar66 = *(undefined1 (*) [16])(lVar32 + uVar44 * 4);
  lVar40 = *(long *)&pRVar5[*(uint *)(uVar45 + 0x48 + lVar41)].ptr[2].numPrimitives;
  lVar43 = *(long *)(lVar43 + lVar33);
  auVar68 = *(undefined1 (*) [16])(lVar43 + uVar47 * 4);
  lVar32 = *(long *)(lVar40 + lVar35);
  auVar69 = *(undefined1 (*) [16])(lVar43 + uVar39 * 4);
  uVar42 = (ulong)*(uint *)(uVar45 + 8 + lVar41);
  auVar56 = *(undefined1 (*) [16])(lVar32 + uVar42 * 4);
  auVar72 = *(undefined1 (*) [16])(lVar43 + uVar34 * 4);
  uVar47 = (ulong)*(uint *)(uVar45 + 0x18 + lVar41);
  auVar59 = *(undefined1 (*) [16])(lVar32 + uVar47 * 4);
  auVar74 = *(undefined1 (*) [16])(lVar43 + uVar44 * 4);
  uVar39 = (ulong)*(uint *)(uVar45 + 0x28 + lVar41);
  auVar62 = *(undefined1 (*) [16])(lVar32 + uVar39 * 4);
  uVar44 = (ulong)*(uint *)(uVar45 + 0x38 + lVar41);
  auVar65 = *(undefined1 (*) [16])(lVar32 + uVar44 * 4);
  lVar40 = *(long *)(lVar40 + lVar33);
  auVar67 = *(undefined1 (*) [16])(lVar40 + uVar42 * 4);
  lVar43 = *(long *)&pRVar5[*(uint *)(uVar45 + 0x4c + lVar41)].ptr[2].numPrimitives;
  lVar32 = *(long *)(lVar43 + lVar35);
  auVar70 = *(undefined1 (*) [16])(lVar40 + uVar47 * 4);
  uVar34 = (ulong)*(uint *)(uVar45 + 0xc + lVar41);
  auVar58 = *(undefined1 (*) [16])(lVar32 + uVar34 * 4);
  auVar106 = *(undefined1 (*) [16])(lVar40 + uVar39 * 4);
  uVar42 = (ulong)*(uint *)(uVar45 + 0x1c + lVar41);
  auVar61 = *(undefined1 (*) [16])(lVar32 + uVar42 * 4);
  auVar55 = vunpcklps_avx512vl(auVar50,auVar56);
  auVar56 = vunpckhps_avx512vl(auVar50,auVar56);
  auVar57 = vunpcklps_avx512vl(auVar51,auVar58);
  auVar51 = vunpckhps_avx(auVar51,auVar58);
  auVar50 = *(undefined1 (*) [16])(lVar40 + uVar44 * 4);
  uVar47 = (ulong)*(uint *)(uVar45 + 0x2c + lVar41);
  auVar56 = vunpcklps_avx(auVar56,auVar51);
  auVar58 = vunpcklps_avx512vl(auVar55,auVar57);
  auVar55 = vunpckhps_avx512vl(auVar55,auVar57);
  auVar51 = vunpcklps_avx512vl(auVar52,auVar59);
  auVar59 = vunpckhps_avx512vl(auVar52,auVar59);
  auVar57 = vunpcklps_avx512vl(auVar60,auVar61);
  auVar60 = vunpckhps_avx512vl(auVar60,auVar61);
  auVar52 = *(undefined1 (*) [16])(lVar32 + uVar47 * 4);
  uVar39 = (ulong)*(uint *)(uVar45 + 0x3c + lVar41);
  auVar60 = vunpcklps_avx(auVar59,auVar60);
  auVar59 = vunpcklps_avx512vl(auVar51,auVar57);
  auVar51 = vunpckhps_avx(auVar51,auVar57);
  auVar61 = vunpcklps_avx512vl(auVar53,auVar62);
  auVar53 = vunpckhps_avx512vl(auVar53,auVar62);
  auVar62 = vunpcklps_avx512vl(auVar63,auVar52);
  auVar63 = vunpckhps_avx512vl(auVar63,auVar52);
  auVar52 = *(undefined1 (*) [16])(lVar32 + uVar39 * 4);
  lVar40 = *(long *)(lVar43 + lVar33);
  auVar63 = vunpcklps_avx(auVar53,auVar63);
  auVar57 = vunpcklps_avx512vl(auVar61,auVar62);
  auVar53 = vunpckhps_avx(auVar61,auVar62);
  auVar62 = vunpcklps_avx512vl(auVar64,auVar65);
  auVar64 = vunpckhps_avx512vl(auVar64,auVar65);
  auVar65 = vunpcklps_avx512vl(auVar66,auVar52);
  auVar66 = vunpckhps_avx512vl(auVar66,auVar52);
  auVar52 = *(undefined1 (*) [16])(lVar40 + uVar34 * 4);
  auVar64 = vunpcklps_avx(auVar64,auVar66);
  auVar66 = vunpcklps_avx512vl(auVar62,auVar65);
  auVar62 = vunpckhps_avx512vl(auVar62,auVar65);
  auVar65 = vunpcklps_avx512vl(auVar48,auVar67);
  auVar48 = vunpckhps_avx512vl(auVar48,auVar67);
  auVar67 = vunpcklps_avx512vl(auVar68,auVar52);
  auVar68 = vunpckhps_avx512vl(auVar68,auVar52);
  auVar52 = *(undefined1 (*) [16])(lVar40 + uVar42 * 4);
  auVar68 = vunpcklps_avx512vl(auVar48,auVar68);
  auVar61 = vunpcklps_avx512vl(auVar65,auVar67);
  auVar65 = vunpckhps_avx512vl(auVar65,auVar67);
  auVar67 = vunpcklps_avx512vl(auVar49,auVar70);
  auVar48 = vunpckhps_avx512vl(auVar49,auVar70);
  auVar49 = vunpcklps_avx512vl(auVar69,auVar52);
  auVar69 = vunpckhps_avx512vl(auVar69,auVar52);
  auVar52 = *(undefined1 (*) [16])(lVar40 + uVar47 * 4);
  auVar48 = vunpcklps_avx(auVar48,auVar69);
  auVar69 = vunpcklps_avx512vl(auVar67,auVar49);
  auVar67 = vunpckhps_avx512vl(auVar67,auVar49);
  auVar70 = vunpcklps_avx512vl(auVar71,auVar106);
  auVar49 = vunpckhps_avx512vl(auVar71,auVar106);
  auVar71 = vunpcklps_avx512vl(auVar72,auVar52);
  auVar72 = vunpckhps_avx512vl(auVar72,auVar52);
  auVar52 = *(undefined1 (*) [16])(lVar40 + uVar39 * 4);
  auVar49 = vunpcklps_avx(auVar49,auVar72);
  auVar72 = vunpcklps_avx512vl(auVar70,auVar71);
  auVar71 = vunpckhps_avx512vl(auVar70,auVar71);
  auVar70 = vunpcklps_avx512vl(auVar73,auVar50);
  auVar50 = vunpckhps_avx512vl(auVar73,auVar50);
  auVar73 = vunpcklps_avx512vl(auVar74,auVar52);
  auVar52 = vunpckhps_avx512vl(auVar74,auVar52);
  auVar50 = vunpcklps_avx(auVar50,auVar52);
  auVar74 = vunpcklps_avx512vl(auVar70,auVar73);
  auVar73 = vunpckhps_avx512vl(auVar70,auVar73);
  auVar52 = ZEXT416((uint)(fVar117 - auVar54._0_4_));
  auVar70 = vbroadcastss_avx512vl(auVar52);
  auVar52 = vsubss_avx512f(ZEXT416(0x3f800000),auVar52);
  auVar106._0_4_ = auVar52._0_4_;
  auVar106._4_4_ = auVar106._0_4_;
  auVar106._8_4_ = auVar106._0_4_;
  auVar106._12_4_ = auVar106._0_4_;
  auVar52 = vmulps_avx512vl(auVar70,auVar61);
  auVar58 = vfmadd231ps_avx512vl(auVar52,auVar106,auVar58);
  auVar52 = vmulps_avx512vl(auVar70,auVar65);
  auVar65 = vfmadd231ps_avx512vl(auVar52,auVar106,auVar55);
  auVar52 = vmulps_avx512vl(auVar70,auVar68);
  auVar52 = vfmadd231ps_fma(auVar52,auVar106,auVar56);
  auVar68 = vmulps_avx512vl(auVar70,auVar69);
  auVar69 = vmulps_avx512vl(auVar70,auVar67);
  auVar56 = vmulps_avx512vl(auVar70,auVar48);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar106,auVar59);
  auVar48 = vfmadd231ps_fma(auVar69,auVar106,auVar51);
  auVar51 = vfmadd231ps_fma(auVar56,auVar106,auVar60);
  auVar60 = vmulps_avx512vl(auVar70,auVar72);
  auVar71 = vmulps_avx512vl(auVar70,auVar71);
  auVar49 = vmulps_avx512vl(auVar70,auVar49);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar106,auVar57);
  auVar53 = vfmadd231ps_fma(auVar71,auVar106,auVar53);
  auVar49 = vfmadd231ps_fma(auVar49,auVar106,auVar63);
  auVar71 = vmulps_avx512vl(auVar70,auVar74);
  auVar73 = vmulps_avx512vl(auVar70,auVar73);
  auVar63 = vmulps_avx512vl(auVar70,auVar50);
  auVar50 = vfmadd231ps_fma(auVar71,auVar106,auVar66);
  auVar71 = vfmadd231ps_fma(auVar73,auVar106,auVar62);
  auVar64 = vfmadd231ps_fma(auVar63,auVar106,auVar64);
  auVar75 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar60,1);
  auVar76 = vinsertf32x4_avx512vl(ZEXT1632(auVar65),auVar53,1);
  auVar85._16_16_ = auVar49;
  auVar85._0_16_ = auVar52;
  auVar86._16_16_ = auVar68;
  auVar86._0_16_ = auVar68;
  auVar88._16_16_ = auVar48;
  auVar88._0_16_ = auVar48;
  auVar89._16_16_ = auVar51;
  auVar89._0_16_ = auVar51;
  auVar87._16_16_ = auVar50;
  auVar87._0_16_ = auVar50;
  auVar91._16_16_ = auVar71;
  auVar91._0_16_ = auVar71;
  uVar107 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar92._4_4_ = uVar107;
  auVar92._0_4_ = uVar107;
  auVar92._8_4_ = uVar107;
  auVar92._12_4_ = uVar107;
  auVar92._16_4_ = uVar107;
  auVar92._20_4_ = uVar107;
  auVar92._24_4_ = uVar107;
  auVar92._28_4_ = uVar107;
  auVar81 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
  auVar77 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
  uVar107 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  auVar108._4_4_ = uVar107;
  auVar108._0_4_ = uVar107;
  auVar108._8_4_ = uVar107;
  auVar108._12_4_ = uVar107;
  auVar108._16_4_ = uVar107;
  auVar108._20_4_ = uVar107;
  auVar108._24_4_ = uVar107;
  auVar108._28_4_ = uVar107;
  uVar107 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  auVar112._4_4_ = uVar107;
  auVar112._0_4_ = uVar107;
  auVar112._8_4_ = uVar107;
  auVar112._12_4_ = uVar107;
  auVar112._16_4_ = uVar107;
  auVar112._20_4_ = uVar107;
  auVar112._24_4_ = uVar107;
  auVar112._28_4_ = uVar107;
  auVar90._16_16_ = auVar64;
  auVar90._0_16_ = auVar64;
  fVar117 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar115._4_4_ = fVar117;
  auVar115._0_4_ = fVar117;
  auVar115._8_4_ = fVar117;
  auVar115._12_4_ = fVar117;
  auVar115._16_4_ = fVar117;
  auVar115._20_4_ = fVar117;
  auVar115._24_4_ = fVar117;
  auVar115._28_4_ = fVar117;
  auVar75 = vsubps_avx(auVar75,auVar92);
  auVar84 = vsubps_avx512vl(auVar76,auVar81);
  auVar85 = vsubps_avx512vl(auVar85,auVar77);
  auVar78 = vsubps_avx512vl(auVar86,auVar92);
  auVar79 = vsubps_avx512vl(auVar88,auVar81);
  auVar86 = vsubps_avx512vl(auVar89,auVar77);
  auVar87 = vsubps_avx512vl(auVar87,auVar92);
  auVar81 = vsubps_avx512vl(auVar91,auVar81);
  auVar77 = vsubps_avx512vl(auVar90,auVar77);
  auVar88 = vsubps_avx512vl(auVar87,auVar75);
  auVar76 = vsubps_avx(auVar81,auVar84);
  auVar89 = vsubps_avx512vl(auVar77,auVar85);
  auVar90 = vsubps_avx512vl(auVar75,auVar78);
  auVar91 = vsubps_avx512vl(auVar84,auVar79);
  auVar92 = vsubps_avx512vl(auVar85,auVar86);
  auVar93 = vaddps_avx512vl(auVar87,auVar75);
  auVar103._0_4_ = auVar81._0_4_ + auVar84._0_4_;
  auVar103._4_4_ = auVar81._4_4_ + auVar84._4_4_;
  auVar103._8_4_ = auVar81._8_4_ + auVar84._8_4_;
  auVar103._12_4_ = auVar81._12_4_ + auVar84._12_4_;
  auVar103._16_4_ = auVar81._16_4_ + auVar84._16_4_;
  auVar103._20_4_ = auVar81._20_4_ + auVar84._20_4_;
  auVar103._24_4_ = auVar81._24_4_ + auVar84._24_4_;
  auVar103._28_4_ = auVar81._28_4_ + auVar84._28_4_;
  auVar82 = vaddps_avx512vl(auVar77,auVar85);
  auVar94._4_4_ = auVar89._4_4_ * auVar103._4_4_;
  auVar94._0_4_ = auVar89._0_4_ * auVar103._0_4_;
  auVar94._8_4_ = auVar89._8_4_ * auVar103._8_4_;
  auVar94._12_4_ = auVar89._12_4_ * auVar103._12_4_;
  auVar94._16_4_ = auVar89._16_4_ * auVar103._16_4_;
  auVar94._20_4_ = auVar89._20_4_ * auVar103._20_4_;
  auVar94._24_4_ = auVar89._24_4_ * auVar103._24_4_;
  auVar94._28_4_ = auVar49._12_4_;
  auVar52 = vfmsub231ps_fma(auVar94,auVar76,auVar82);
  auVar83._4_4_ = auVar88._4_4_ * auVar82._4_4_;
  auVar83._0_4_ = auVar88._0_4_ * auVar82._0_4_;
  auVar83._8_4_ = auVar88._8_4_ * auVar82._8_4_;
  auVar83._12_4_ = auVar88._12_4_ * auVar82._12_4_;
  auVar83._16_4_ = auVar88._16_4_ * auVar82._16_4_;
  auVar83._20_4_ = auVar88._20_4_ * auVar82._20_4_;
  auVar83._24_4_ = auVar88._24_4_ * auVar82._24_4_;
  auVar83._28_4_ = auVar82._28_4_;
  auVar50 = vfmsub231ps_fma(auVar83,auVar89,auVar93);
  auVar82._4_4_ = auVar76._4_4_ * auVar93._4_4_;
  auVar82._0_4_ = auVar76._0_4_ * auVar93._0_4_;
  auVar82._8_4_ = auVar76._8_4_ * auVar93._8_4_;
  auVar82._12_4_ = auVar76._12_4_ * auVar93._12_4_;
  auVar82._16_4_ = auVar76._16_4_ * auVar93._16_4_;
  auVar82._20_4_ = auVar76._20_4_ * auVar93._20_4_;
  auVar82._24_4_ = auVar76._24_4_ * auVar93._24_4_;
  auVar82._28_4_ = auVar93._28_4_;
  auVar53 = vfmsub231ps_fma(auVar82,auVar88,auVar103);
  auVar95._0_4_ = fVar117 * auVar53._0_4_;
  auVar95._4_4_ = fVar117 * auVar53._4_4_;
  auVar95._8_4_ = fVar117 * auVar53._8_4_;
  auVar95._12_4_ = fVar117 * auVar53._12_4_;
  auVar95._16_4_ = fVar117 * 0.0;
  auVar95._20_4_ = fVar117 * 0.0;
  auVar95._24_4_ = fVar117 * 0.0;
  auVar95._28_4_ = 0;
  auVar50 = vfmadd231ps_fma(auVar95,auVar112,ZEXT1632(auVar50));
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar108,ZEXT1632(auVar52));
  auVar94 = vaddps_avx512vl(auVar75,auVar78);
  auVar83 = vaddps_avx512vl(auVar84,auVar79);
  auVar82 = vaddps_avx512vl(auVar85,auVar86);
  auVar93 = vmulps_avx512vl(auVar83,auVar92);
  auVar95 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar82);
  auVar93._4_4_ = auVar90._4_4_ * auVar82._4_4_;
  auVar93._0_4_ = auVar90._0_4_ * auVar82._0_4_;
  auVar93._8_4_ = auVar90._8_4_ * auVar82._8_4_;
  auVar93._12_4_ = auVar90._12_4_ * auVar82._12_4_;
  auVar93._16_4_ = auVar90._16_4_ * auVar82._16_4_;
  auVar93._20_4_ = auVar90._20_4_ * auVar82._20_4_;
  auVar93._24_4_ = auVar90._24_4_ * auVar82._24_4_;
  auVar93._28_4_ = auVar82._28_4_;
  auVar82 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar94);
  auVar94 = vmulps_avx512vl(auVar94,auVar91);
  auVar52 = vfmsub231ps_fma(auVar94,auVar90,auVar83);
  auVar94 = vsubps_avx512vl(auVar78,auVar87);
  auVar114._0_4_ = fVar117 * auVar52._0_4_;
  auVar114._4_4_ = fVar117 * auVar52._4_4_;
  auVar114._8_4_ = fVar117 * auVar52._8_4_;
  auVar114._12_4_ = fVar117 * auVar52._12_4_;
  auVar114._16_4_ = fVar117 * 0.0;
  auVar114._20_4_ = fVar117 * 0.0;
  auVar114._24_4_ = fVar117 * 0.0;
  auVar114._28_4_ = 0;
  auVar52 = vfmadd231ps_fma(auVar114,auVar112,auVar82);
  auVar83 = vsubps_avx512vl(auVar79,auVar81);
  local_2540 = vfmadd231ps_avx512vl(ZEXT1632(auVar52),auVar108,auVar95);
  auVar82 = vsubps_avx512vl(auVar86,auVar77);
  auVar78 = vaddps_avx512vl(auVar78,auVar87);
  auVar81 = vaddps_avx512vl(auVar79,auVar81);
  auVar77 = vaddps_avx512vl(auVar86,auVar77);
  auVar79 = vmulps_avx512vl(auVar81,auVar82);
  auVar79 = vfmsub231ps_avx512vl(auVar79,auVar83,auVar77);
  auVar77 = vmulps_avx512vl(auVar77,auVar94);
  auVar77 = vfmsub231ps_avx512vl(auVar77,auVar82,auVar78);
  auVar78 = vmulps_avx512vl(auVar78,auVar83);
  auVar81 = vfmsub231ps_avx512vl(auVar78,auVar94,auVar81);
  auVar81 = vmulps_avx512vl(auVar115,auVar81);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar112,auVar77);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar108,auVar79);
  auVar125._0_4_ = local_2540._0_4_ + auVar50._0_4_;
  auVar125._4_4_ = local_2540._4_4_ + auVar50._4_4_;
  auVar125._8_4_ = local_2540._8_4_ + auVar50._8_4_;
  auVar125._12_4_ = local_2540._12_4_ + auVar50._12_4_;
  auVar125._16_4_ = local_2540._16_4_ + 0.0;
  auVar125._20_4_ = local_2540._20_4_ + 0.0;
  auVar125._24_4_ = local_2540._24_4_ + 0.0;
  auVar125._28_4_ = local_2540._28_4_ + 0.0;
  local_2520 = vaddps_avx512vl(auVar81,auVar125);
  auVar77._8_4_ = 0x7fffffff;
  auVar77._0_8_ = 0x7fffffff7fffffff;
  auVar77._12_4_ = 0x7fffffff;
  auVar77._16_4_ = 0x7fffffff;
  auVar77._20_4_ = 0x7fffffff;
  auVar77._24_4_ = 0x7fffffff;
  auVar77._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_2520,auVar77);
  auVar78._8_4_ = 0x34000000;
  auVar78._0_8_ = 0x3400000034000000;
  auVar78._12_4_ = 0x34000000;
  auVar78._16_4_ = 0x34000000;
  auVar78._20_4_ = 0x34000000;
  auVar78._24_4_ = 0x34000000;
  auVar78._28_4_ = 0x34000000;
  auVar77 = vmulps_avx512vl(local_2520,auVar78);
  auVar78 = vminps_avx512vl(ZEXT1632(auVar50),local_2540);
  auVar78 = vminps_avx512vl(auVar78,auVar81);
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar79._16_4_ = 0x80000000;
  auVar79._20_4_ = 0x80000000;
  auVar79._24_4_ = 0x80000000;
  auVar79._28_4_ = 0x80000000;
  auVar79 = vxorps_avx512vl(auVar77,auVar79);
  uVar109 = vcmpps_avx512vl(auVar78,auVar79,5);
  auVar78 = vmaxps_avx512vl(ZEXT1632(auVar50),local_2540);
  auVar81 = vmaxps_avx512vl(auVar78,auVar81);
  uVar13 = vcmpps_avx512vl(auVar81,auVar77,2);
  auVar81 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar45 + 0x10 + lVar41));
  local_2580 = vmovdqa64_avx512vl(auVar81);
  auVar81 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar45 + 0x14 + lVar41));
  local_26a0 = vmovdqa64_avx512vl(auVar81);
  local_24a0 = (byte)uVar109 | (byte)uVar13;
  if (local_24a0 != 0) {
    auVar81 = vmulps_avx512vl(auVar89,auVar91);
    auVar77 = vmulps_avx512vl(auVar88,auVar92);
    auVar78 = vmulps_avx512vl(auVar76,auVar90);
    auVar79 = vmulps_avx512vl(auVar92,auVar83);
    auVar93 = vmulps_avx512vl(auVar90,auVar82);
    auVar86 = vmulps_avx512vl(auVar91,auVar94);
    auVar76 = vfmsub213ps_avx512vl(auVar76,auVar92,auVar81);
    auVar87 = vfmsub213ps_avx512vl(auVar89,auVar90,auVar77);
    auVar88 = vfmsub213ps_avx512vl(auVar88,auVar91,auVar78);
    auVar82 = vfmsub213ps_avx512vl(auVar82,auVar91,auVar79);
    auVar94 = vfmsub213ps_avx512vl(auVar94,auVar92,auVar93);
    auVar83 = vfmsub213ps_avx512vl(auVar83,auVar90,auVar86);
    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    vandps_avx512vl(auVar81,auVar89);
    vandps_avx512vl(auVar79,auVar89);
    uVar47 = vcmpps_avx512vl(auVar89,auVar89,1);
    vandps_avx512vl(auVar77,auVar89);
    vandps_avx512vl(auVar93,auVar89);
    uVar34 = vcmpps_avx512vl(auVar89,auVar89,1);
    vandps_avx512vl(auVar78,auVar89);
    vandps_avx512vl(auVar86,auVar89);
    uVar39 = vcmpps_avx512vl(auVar89,auVar89,1);
    bVar46 = (bool)((byte)uVar47 & 1);
    local_2500._0_4_ = (float)((uint)bVar46 * auVar76._0_4_ | (uint)!bVar46 * auVar82._0_4_);
    bVar46 = (bool)((byte)(uVar47 >> 1) & 1);
    local_2500._4_4_ = (float)((uint)bVar46 * auVar76._4_4_ | (uint)!bVar46 * auVar82._4_4_);
    bVar46 = (bool)((byte)(uVar47 >> 2) & 1);
    local_2500._8_4_ = (float)((uint)bVar46 * auVar76._8_4_ | (uint)!bVar46 * auVar82._8_4_);
    bVar46 = (bool)((byte)(uVar47 >> 3) & 1);
    local_2500._12_4_ = (float)((uint)bVar46 * auVar76._12_4_ | (uint)!bVar46 * auVar82._12_4_);
    bVar46 = (bool)((byte)(uVar47 >> 4) & 1);
    local_2500._16_4_ = (float)((uint)bVar46 * auVar76._16_4_ | (uint)!bVar46 * auVar82._16_4_);
    bVar46 = (bool)((byte)(uVar47 >> 5) & 1);
    local_2500._20_4_ = (float)((uint)bVar46 * auVar76._20_4_ | (uint)!bVar46 * auVar82._20_4_);
    bVar46 = (bool)((byte)(uVar47 >> 6) & 1);
    local_2500._24_4_ = (float)((uint)bVar46 * auVar76._24_4_ | (uint)!bVar46 * auVar82._24_4_);
    bVar46 = SUB81(uVar47 >> 7,0);
    local_2500._28_4_ = (uint)bVar46 * auVar76._28_4_ | (uint)!bVar46 * auVar82._28_4_;
    bVar46 = (bool)((byte)uVar34 & 1);
    local_24e0._0_4_ = (float)((uint)bVar46 * auVar87._0_4_ | (uint)!bVar46 * auVar94._0_4_);
    bVar46 = (bool)((byte)(uVar34 >> 1) & 1);
    local_24e0._4_4_ = (float)((uint)bVar46 * auVar87._4_4_ | (uint)!bVar46 * auVar94._4_4_);
    bVar46 = (bool)((byte)(uVar34 >> 2) & 1);
    local_24e0._8_4_ = (float)((uint)bVar46 * auVar87._8_4_ | (uint)!bVar46 * auVar94._8_4_);
    bVar46 = (bool)((byte)(uVar34 >> 3) & 1);
    local_24e0._12_4_ = (float)((uint)bVar46 * auVar87._12_4_ | (uint)!bVar46 * auVar94._12_4_);
    bVar46 = (bool)((byte)(uVar34 >> 4) & 1);
    local_24e0._16_4_ = (float)((uint)bVar46 * auVar87._16_4_ | (uint)!bVar46 * auVar94._16_4_);
    bVar46 = (bool)((byte)(uVar34 >> 5) & 1);
    local_24e0._20_4_ = (float)((uint)bVar46 * auVar87._20_4_ | (uint)!bVar46 * auVar94._20_4_);
    bVar46 = (bool)((byte)(uVar34 >> 6) & 1);
    local_24e0._24_4_ = (float)((uint)bVar46 * auVar87._24_4_ | (uint)!bVar46 * auVar94._24_4_);
    bVar46 = SUB81(uVar34 >> 7,0);
    local_24e0._28_4_ = (uint)bVar46 * auVar87._28_4_ | (uint)!bVar46 * auVar94._28_4_;
    bVar46 = (bool)((byte)uVar39 & 1);
    local_24c0 = (float)((uint)bVar46 * auVar88._0_4_ | (uint)!bVar46 * auVar83._0_4_);
    bVar46 = (bool)((byte)(uVar39 >> 1) & 1);
    fStack_24bc = (float)((uint)bVar46 * auVar88._4_4_ | (uint)!bVar46 * auVar83._4_4_);
    bVar46 = (bool)((byte)(uVar39 >> 2) & 1);
    fStack_24b8 = (float)((uint)bVar46 * auVar88._8_4_ | (uint)!bVar46 * auVar83._8_4_);
    bVar46 = (bool)((byte)(uVar39 >> 3) & 1);
    fStack_24b4 = (float)((uint)bVar46 * auVar88._12_4_ | (uint)!bVar46 * auVar83._12_4_);
    bVar46 = (bool)((byte)(uVar39 >> 4) & 1);
    fStack_24b0 = (float)((uint)bVar46 * auVar88._16_4_ | (uint)!bVar46 * auVar83._16_4_);
    bVar46 = (bool)((byte)(uVar39 >> 5) & 1);
    fStack_24ac = (float)((uint)bVar46 * auVar88._20_4_ | (uint)!bVar46 * auVar83._20_4_);
    bVar46 = (bool)((byte)(uVar39 >> 6) & 1);
    fStack_24a8 = (float)((uint)bVar46 * auVar88._24_4_ | (uint)!bVar46 * auVar83._24_4_);
    bVar46 = SUB81(uVar39 >> 7,0);
    uStack_24a4 = (uint)bVar46 * auVar88._28_4_ | (uint)!bVar46 * auVar83._28_4_;
    auVar27._4_4_ = fVar117 * fStack_24bc;
    auVar27._0_4_ = fVar117 * local_24c0;
    auVar27._8_4_ = fVar117 * fStack_24b8;
    auVar27._12_4_ = fVar117 * fStack_24b4;
    auVar27._16_4_ = fVar117 * fStack_24b0;
    auVar27._20_4_ = fVar117 * fStack_24ac;
    auVar27._24_4_ = fVar117 * fStack_24a8;
    auVar27._28_4_ = fVar117;
    auVar52 = vfmadd213ps_fma(auVar112,local_24e0,auVar27);
    auVar52 = vfmadd213ps_fma(auVar108,local_2500,ZEXT1632(auVar52));
    auVar81 = ZEXT1632(CONCAT412(auVar52._12_4_ + auVar52._12_4_,
                                 CONCAT48(auVar52._8_4_ + auVar52._8_4_,
                                          CONCAT44(auVar52._4_4_ + auVar52._4_4_,
                                                   auVar52._0_4_ + auVar52._0_4_))));
    auVar113._0_4_ = auVar85._0_4_ * local_24c0;
    auVar113._4_4_ = auVar85._4_4_ * fStack_24bc;
    auVar113._8_4_ = auVar85._8_4_ * fStack_24b8;
    auVar113._12_4_ = auVar85._12_4_ * fStack_24b4;
    auVar113._16_4_ = auVar85._16_4_ * fStack_24b0;
    auVar113._20_4_ = auVar85._20_4_ * fStack_24ac;
    auVar113._24_4_ = auVar85._24_4_ * fStack_24a8;
    auVar113._28_4_ = 0;
    auVar52 = vfmadd213ps_fma(auVar84,local_24e0,auVar113);
    auVar53 = vfmadd213ps_fma(auVar75,local_2500,ZEXT1632(auVar52));
    auVar75 = vrcp14ps_avx512vl(auVar81);
    auVar84._8_4_ = 0x3f800000;
    auVar84._0_8_ = 0x3f8000003f800000;
    auVar84._12_4_ = 0x3f800000;
    auVar84._16_4_ = 0x3f800000;
    auVar84._20_4_ = 0x3f800000;
    auVar84._24_4_ = 0x3f800000;
    auVar84._28_4_ = 0x3f800000;
    auVar76 = vfnmadd213ps_avx512vl(auVar75,auVar81,auVar84);
    auVar52 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
    local_2440 = ZEXT1632(CONCAT412((auVar53._12_4_ + auVar53._12_4_) * auVar52._12_4_,
                                    CONCAT48((auVar53._8_4_ + auVar53._8_4_) * auVar52._8_4_,
                                             CONCAT44((auVar53._4_4_ + auVar53._4_4_) *
                                                      auVar52._4_4_,
                                                      (auVar53._0_4_ + auVar53._0_4_) *
                                                      auVar52._0_4_))));
    auVar102 = ZEXT3264(local_2440);
    uVar107 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar17._4_4_ = uVar107;
    auVar17._0_4_ = uVar107;
    auVar17._8_4_ = uVar107;
    auVar17._12_4_ = uVar107;
    auVar17._16_4_ = uVar107;
    auVar17._20_4_ = uVar107;
    auVar17._24_4_ = uVar107;
    auVar17._28_4_ = uVar107;
    uVar109 = vcmpps_avx512vl(local_2440,auVar17,0xd);
    auVar18._8_4_ = 0x80000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar18._12_4_ = 0x80000000;
    auVar18._16_4_ = 0x80000000;
    auVar18._20_4_ = 0x80000000;
    auVar18._24_4_ = 0x80000000;
    auVar18._28_4_ = 0x80000000;
    auVar75 = vxorps_avx512vl(auVar81,auVar18);
    fVar117 = (ray->super_RayK<1>).tfar;
    auVar19._4_4_ = fVar117;
    auVar19._0_4_ = fVar117;
    auVar19._8_4_ = fVar117;
    auVar19._12_4_ = fVar117;
    auVar19._16_4_ = fVar117;
    auVar19._20_4_ = fVar117;
    auVar19._24_4_ = fVar117;
    auVar19._28_4_ = fVar117;
    uVar13 = vcmpps_avx512vl(local_2440,auVar19,2);
    uVar14 = vcmpps_avx512vl(auVar81,auVar75,4);
    local_24a0 = (byte)uVar109 & (byte)uVar13 & (byte)uVar14 & local_24a0;
    uVar47 = (ulong)local_24a0;
    if (local_24a0 != 0) {
      auVar75 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
      auVar104 = ZEXT3264(auVar75);
      uVar30 = vextractps_avx(auVar75._0_16_,1);
      local_2560 = ZEXT1632(auVar50);
      local_23c0 = 0xf0;
      auVar20._8_4_ = 0x219392ef;
      auVar20._0_8_ = 0x219392ef219392ef;
      auVar20._12_4_ = 0x219392ef;
      auVar20._16_4_ = 0x219392ef;
      auVar20._20_4_ = 0x219392ef;
      auVar20._24_4_ = 0x219392ef;
      auVar20._28_4_ = 0x219392ef;
      uVar34 = vcmpps_avx512vl(local_2520,auVar20,5);
      auVar76 = vrcp14ps_avx512vl(local_2520);
      auVar111._8_4_ = 0x3f800000;
      auVar111._0_8_ = 0x3f8000003f800000;
      auVar111._12_4_ = 0x3f800000;
      auVar111._16_4_ = 0x3f800000;
      auVar111._20_4_ = 0x3f800000;
      auVar111._24_4_ = 0x3f800000;
      auVar111._28_4_ = 0x3f800000;
      auVar52 = vfnmadd213ps_fma(local_2520,auVar76,auVar111);
      auVar75 = vfmadd132ps_avx512vl(ZEXT1632(auVar52),auVar76,auVar76);
      fVar118 = (float)((uint)((byte)uVar34 & 1) * auVar75._0_4_);
      fVar117 = (float)((uint)((byte)(uVar34 >> 1) & 1) * auVar75._4_4_);
      fVar105 = (float)((uint)((byte)(uVar34 >> 2) & 1) * auVar75._8_4_);
      fVar122 = (float)((uint)((byte)(uVar34 >> 3) & 1) * auVar75._12_4_);
      fVar121 = (float)((uint)((byte)(uVar34 >> 4) & 1) * auVar75._16_4_);
      fVar120 = (float)((uint)((byte)(uVar34 >> 5) & 1) * auVar75._20_4_);
      fVar119 = (float)((uint)((byte)(uVar34 >> 6) & 1) * auVar75._24_4_);
      auVar99._0_4_ = fVar118 * auVar50._0_4_;
      auVar99._4_4_ = fVar117 * auVar50._4_4_;
      auVar99._8_4_ = fVar105 * auVar50._8_4_;
      auVar99._12_4_ = fVar122 * auVar50._12_4_;
      auVar99._16_4_ = fVar121 * 0.0;
      auVar99._20_4_ = fVar120 * 0.0;
      auVar99._24_4_ = fVar119 * 0.0;
      auVar99._28_4_ = 0;
      auVar75 = vminps_avx(auVar99,auVar111);
      auVar28._4_4_ = local_2540._4_4_ * fVar117;
      auVar28._0_4_ = local_2540._0_4_ * fVar118;
      auVar28._8_4_ = local_2540._8_4_ * fVar105;
      auVar28._12_4_ = local_2540._12_4_ * fVar122;
      auVar28._16_4_ = local_2540._16_4_ * fVar121;
      auVar28._20_4_ = local_2540._20_4_ * fVar120;
      auVar28._24_4_ = local_2540._24_4_ * fVar119;
      auVar28._28_4_ = auVar76._28_4_;
      auVar76 = vminps_avx(auVar28,auVar111);
      auVar81 = vsubps_avx(auVar111,auVar75);
      auVar77 = vsubps_avx(auVar111,auVar76);
      local_2460 = vblendps_avx(auVar76,auVar81,0xf0);
      local_2480 = vblendps_avx(auVar75,auVar77,0xf0);
      local_2420[0] = local_2500._0_4_ * 1.0;
      local_2420[1] = local_2500._4_4_ * 1.0;
      local_2420[2] = local_2500._8_4_ * 1.0;
      local_2420[3] = local_2500._12_4_ * 1.0;
      fStack_2410 = local_2500._16_4_ * -1.0;
      fStack_240c = local_2500._20_4_ * -1.0;
      fStack_2408 = local_2500._24_4_ * -1.0;
      uStack_2404 = local_2480._28_4_;
      local_2400[0] = local_24e0._0_4_ * 1.0;
      local_2400[1] = local_24e0._4_4_ * 1.0;
      local_2400[2] = local_24e0._8_4_ * 1.0;
      local_2400[3] = local_24e0._12_4_ * 1.0;
      fStack_23f0 = local_24e0._16_4_ * -1.0;
      fStack_23ec = local_24e0._20_4_ * -1.0;
      fStack_23e8 = local_24e0._24_4_ * -1.0;
      uStack_23e4 = local_24e0._28_4_;
      local_23e0[0] = local_24c0 * 1.0;
      local_23e0[1] = fStack_24bc * 1.0;
      local_23e0[2] = fStack_24b8 * 1.0;
      local_23e0[3] = fStack_24b4 * 1.0;
      fStack_23d0 = fStack_24b0 * -1.0;
      fStack_23cc = fStack_24ac * -1.0;
      fStack_23c8 = fStack_24a8 * -1.0;
      uStack_23c4 = uStack_24a4;
      auVar100._8_4_ = 0x7f800000;
      auVar100._0_8_ = 0x7f8000007f800000;
      auVar100._12_4_ = 0x7f800000;
      auVar100._16_4_ = 0x7f800000;
      auVar100._20_4_ = 0x7f800000;
      auVar100._24_4_ = 0x7f800000;
      auVar100._28_4_ = 0x7f800000;
      auVar75 = vblendmps_avx512vl(auVar100,local_2440);
      auVar96._0_4_ =
           (uint)(local_24a0 & 1) * auVar75._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
      bVar46 = (bool)(local_24a0 >> 1 & 1);
      auVar96._4_4_ = (uint)bVar46 * auVar75._4_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)(local_24a0 >> 2 & 1);
      auVar96._8_4_ = (uint)bVar46 * auVar75._8_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)(local_24a0 >> 3 & 1);
      auVar96._12_4_ = (uint)bVar46 * auVar75._12_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)(local_24a0 >> 4 & 1);
      auVar96._16_4_ = (uint)bVar46 * auVar75._16_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)(local_24a0 >> 5 & 1);
      auVar96._20_4_ = (uint)bVar46 * auVar75._20_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)(local_24a0 >> 6 & 1);
      auVar96._24_4_ = (uint)bVar46 * auVar75._24_4_ | (uint)!bVar46 * 0x7f800000;
      auVar96._28_4_ =
           (uint)(local_24a0 >> 7) * auVar75._28_4_ | (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
      auVar75 = vshufps_avx(auVar96,auVar96,0xb1);
      auVar75 = vminps_avx(auVar96,auVar75);
      auVar76 = vshufpd_avx(auVar75,auVar75,5);
      auVar75 = vminps_avx(auVar75,auVar76);
      auVar76 = vpermpd_avx2(auVar75,0x4e);
      auVar75 = vminps_avx(auVar75,auVar76);
      uVar109 = vcmpps_avx512vl(auVar96,auVar75,0);
      bVar29 = local_24a0;
      if (((byte)uVar109 & local_24a0) != 0) {
        bVar29 = (byte)uVar109 & local_24a0;
      }
LAB_01c72869:
      auVar50 = auVar137._0_16_;
      uVar16 = 0;
      for (uVar38 = (uint)bVar29; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
        uVar16 = uVar16 + 1;
      }
      local_2738 = *(uint *)(local_2580 + (ulong)uVar16 * 4);
      pGVar6 = (pSVar4->geometries).items[local_2738].ptr;
      if ((pGVar6->mask & uVar30) == 0) {
        uVar47 = (ulong)(byte)(~(byte)(1 << (uVar16 & 0x1f)) & (byte)uVar47);
      }
      else {
        pRVar7 = context->args;
        local_26c0 = auVar104._0_32_;
        if (pRVar7->filter == (RTCFilterFunctionN)0x0) {
          local_2780.context = context->user;
          if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
            uVar47 = (ulong)(uVar16 << 2);
            fVar117 = *(float *)(local_2480 + uVar47);
            fVar118 = *(float *)(local_2460 + uVar47);
            (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar47);
            (ray->Ng).field_0.field_0.x = *(float *)((long)local_2420 + uVar47);
            (ray->Ng).field_0.field_0.y = *(float *)((long)local_2400 + uVar47);
            (ray->Ng).field_0.field_0.z = *(float *)((long)local_23e0 + uVar47);
            ray->u = fVar117;
            ray->v = fVar118;
            ray->primID = *(uint *)(local_26a0 + uVar47);
            ray->geomID = local_2738;
            ray->instID[0] = (local_2780.context)->instID[0];
            ray->instPrimID[0] = (local_2780.context)->instPrimID[0];
            goto LAB_01c72c36;
          }
        }
        else {
          local_2780.context = context->user;
        }
        uVar34 = (ulong)(uVar16 * 4);
        local_2750 = *(float *)((long)local_2420 + uVar34);
        local_274c = *(undefined4 *)((long)local_2400 + uVar34);
        local_2748 = *(undefined4 *)((long)local_23e0 + uVar34);
        local_2744 = *(undefined4 *)(local_2480 + uVar34);
        local_2740 = *(undefined4 *)(local_2460 + uVar34);
        local_273c = *(undefined4 *)(local_26a0 + uVar34);
        local_2734 = (local_2780.context)->instID[0];
        local_2730 = (local_2780.context)->instPrimID[0];
        (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar34);
        local_27a4 = -1;
        local_2780.valid = &local_27a4;
        local_2780.geometryUserPtr = pGVar6->userPtr;
        local_2780.ray = (RTCRayN *)ray;
        local_2780.hit = (RTCHitN *)&local_2750;
        local_2780.N = 1;
        local_2720 = auVar102._0_32_;
        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c72aa6:
          auVar50 = auVar137._0_16_;
          if ((pRVar7->filter != (RTCFilterFunctionN)0x0) &&
             (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
            (*pRVar7->filter)(&local_2780);
            auVar102 = ZEXT3264(local_2720);
            auVar139 = ZEXT3264(local_2700);
            auVar138 = ZEXT3264(local_26e0);
            auVar50 = vxorps_avx512vl(auVar50,auVar50);
            auVar137 = ZEXT1664(auVar50);
            if (*local_2780.valid == 0) goto LAB_01c72b76;
          }
          (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.x = *(float *)local_2780.hit;
          (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_2780.hit + 4);
          (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_2780.hit + 8);
          *(float *)((long)local_2780.ray + 0x3c) = *(float *)(local_2780.hit + 0xc);
          *(float *)((long)local_2780.ray + 0x40) = *(float *)(local_2780.hit + 0x10);
          *(float *)((long)local_2780.ray + 0x44) = *(float *)(local_2780.hit + 0x14);
          *(float *)((long)local_2780.ray + 0x48) = *(float *)(local_2780.hit + 0x18);
          *(float *)((long)local_2780.ray + 0x4c) = *(float *)(local_2780.hit + 0x1c);
          *(float *)((long)local_2780.ray + 0x50) = *(float *)(local_2780.hit + 0x20);
        }
        else {
          (*pGVar6->intersectionFilterN)(&local_2780);
          auVar102 = ZEXT3264(local_2720);
          auVar139 = ZEXT3264(local_2700);
          auVar138 = ZEXT3264(local_26e0);
          auVar50 = vxorps_avx512vl(auVar50,auVar50);
          auVar137 = ZEXT1664(auVar50);
          if (*local_2780.valid != 0) goto LAB_01c72aa6;
LAB_01c72b76:
          (ray->super_RayK<1>).tfar = (float)local_26c0._0_4_;
        }
        fVar117 = (ray->super_RayK<1>).tfar;
        auVar21._4_4_ = fVar117;
        auVar21._0_4_ = fVar117;
        auVar21._8_4_ = fVar117;
        auVar21._12_4_ = fVar117;
        auVar21._16_4_ = fVar117;
        auVar21._20_4_ = fVar117;
        auVar21._24_4_ = fVar117;
        auVar21._28_4_ = fVar117;
        uVar34 = vcmpps_avx512vl(auVar102._0_32_,auVar21,2);
        uVar47 = (byte)(~(byte)(1 << (uVar16 & 0x1f)) & (byte)uVar47) & uVar34;
        uVar30 = (ray->super_RayK<1>).mask;
        auVar104 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      bVar29 = (byte)uVar47;
      if (bVar29 == 0) goto LAB_01c72c36;
      auVar101._8_4_ = 0x7f800000;
      auVar101._0_8_ = 0x7f8000007f800000;
      auVar101._12_4_ = 0x7f800000;
      auVar101._16_4_ = 0x7f800000;
      auVar101._20_4_ = 0x7f800000;
      auVar101._24_4_ = 0x7f800000;
      auVar101._28_4_ = 0x7f800000;
      auVar75 = vblendmps_avx512vl(auVar101,auVar102._0_32_);
      auVar97._0_4_ = (uint)(bVar29 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar29 & 1) * 0x7f800000;
      bVar46 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar97._4_4_ = (uint)bVar46 * auVar75._4_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar97._8_4_ = (uint)bVar46 * auVar75._8_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar97._12_4_ = (uint)bVar46 * auVar75._12_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)((byte)(uVar47 >> 4) & 1);
      auVar97._16_4_ = (uint)bVar46 * auVar75._16_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)((byte)(uVar47 >> 5) & 1);
      auVar97._20_4_ = (uint)bVar46 * auVar75._20_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = (bool)((byte)(uVar47 >> 6) & 1);
      auVar97._24_4_ = (uint)bVar46 * auVar75._24_4_ | (uint)!bVar46 * 0x7f800000;
      bVar46 = SUB81(uVar47 >> 7,0);
      auVar97._28_4_ = (uint)bVar46 * auVar75._28_4_ | (uint)!bVar46 * 0x7f800000;
      auVar75 = vshufps_avx(auVar97,auVar97,0xb1);
      auVar75 = vminps_avx(auVar97,auVar75);
      auVar76 = vshufpd_avx(auVar75,auVar75,5);
      auVar75 = vminps_avx(auVar75,auVar76);
      auVar76 = vpermpd_avx2(auVar75,0x4e);
      auVar75 = vminps_avx(auVar75,auVar76);
      uVar109 = vcmpps_avx512vl(auVar97,auVar75,0);
      bVar36 = (byte)uVar109 & bVar29;
      if (bVar36 != 0) {
        bVar29 = bVar36;
      }
      goto LAB_01c72869;
    }
  }
LAB_01c72c36:
  local_2788 = local_2788 + 1;
  auVar116 = ZEXT3264(local_25a0);
  auVar123 = ZEXT3264(local_25e0);
  auVar124 = ZEXT3264(local_2600);
  auVar132 = ZEXT3264(local_2640);
  auVar133 = ZEXT3264(local_2660);
  auVar134 = ZEXT3264(local_2680);
  lVar40 = local_2798;
  lVar43 = local_27a0;
  fVar105 = local_25c0;
  fVar117 = fStack_25bc;
  fVar118 = fStack_25b8;
  fVar119 = fStack_25b4;
  fVar120 = fStack_25b0;
  fVar121 = fStack_25ac;
  fVar122 = fStack_25a8;
  fVar98 = local_2620;
  fVar126 = fStack_261c;
  fVar127 = fStack_2618;
  fVar128 = fStack_2614;
  fVar129 = fStack_2610;
  fVar130 = fStack_260c;
  fVar131 = fStack_2608;
  goto LAB_01c71ff3;
LAB_01c72c98:
  fVar2 = (ray->super_RayK<1>).tfar;
  auVar102 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(
                                                  fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  auVar104 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
  auVar75 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar135 = ZEXT3264(auVar75);
  auVar75 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar136 = ZEXT3264(auVar75);
  goto LAB_01c71bc5;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }